

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_casts.cpp
# Opt level: O3

BoundCastInfo *
duckdb::DefaultCasts::ListCastSwitch
          (BoundCastInfo *__return_storage_ptr__,BindCastInput *input,LogicalType *source,
          LogicalType *target)

{
  LogicalTypeId LVar1;
  LogicalType *source_00;
  LogicalType *target_00;
  pointer *__ptr;
  vector<duckdb::BoundCastInfo,_true> child_cast_info;
  undefined1 local_88 [32];
  pointer local_68;
  element_type *peStack_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  BoundCastInfo local_50;
  GetCastFunctionInput local_38;
  
  LVar1 = target->id_;
  if (LVar1 == VARCHAR) {
    LogicalType::LogicalType((LogicalType *)&local_50,VARCHAR);
    LogicalType::LIST((LogicalType *)&local_68,(LogicalType *)&local_50);
    ListBoundCastData::BindListToListCast
              ((ListBoundCastData *)local_88,input,source,(LogicalType *)&local_68);
    BoundCastInfo::BoundCastInfo
              (__return_storage_ptr__,ListToVarcharCast,
               (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                *)local_88,ListBoundCastData::InitListLocalState);
    if ((_func_int **)local_88._0_8_ != (_func_int **)0x0) {
      (**(code **)(*(_func_int **)local_88._0_8_ + 8))();
    }
    local_88._0_8_ = (_func_int **)0x0;
    LogicalType::~LogicalType((LogicalType *)&local_68);
    LogicalType::~LogicalType((LogicalType *)&local_50);
  }
  else {
    if (LVar1 == ARRAY) {
      local_68 = (pointer)0x0;
      peStack_60 = (element_type *)0x0;
      local_58._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      source_00 = ListType::GetChildType(source);
      target_00 = ArrayType::GetChildType(target);
      local_38.context.ptr = (input->context).ptr;
      local_38.query_location.index = (input->query_location).index;
      CastFunctionSet::GetCastFunction(&local_50,input->function_set,source_00,target_00,&local_38);
      local_88._16_8_ = operator_new(0x20);
      ((BoundCastData *)(local_88._16_8_ + 8))->_vptr_BoundCastData =
           (_func_int **)local_50.function;
      ((BoundCastData *)(local_88._16_8_ + 0x10))->_vptr_BoundCastData =
           (_func_int **)local_50.init_local_state;
      ((BoundCastData *)local_88._16_8_)->_vptr_BoundCastData =
           (_func_int **)&PTR__ListBoundCastData_0243c960;
      ((BoundCastData *)(local_88._16_8_ + 0x18))->_vptr_BoundCastData =
           (_func_int **)
           local_50.cast_data.
           super_unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>._M_t
           .
           super___uniq_ptr_impl<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>_>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>
           .super__Head_base<0UL,_duckdb::BoundCastData_*,_false>._M_head_impl;
      ::std::vector<duckdb::BoundCastInfo,_std::allocator<duckdb::BoundCastInfo>_>::~vector
                ((vector<duckdb::BoundCastInfo,_std::allocator<duckdb::BoundCastInfo>_> *)&local_68)
      ;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,ListToArrayCast,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)(local_88 + 0x10),ListBoundCastData::InitListLocalState);
      local_88._24_8_ = local_88._16_8_;
    }
    else if (LVar1 == LIST) {
      ListBoundCastData::BindListToListCast
                ((ListBoundCastData *)(local_88 + 0x18),input,source,target);
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,ListCast::ListToListCast,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)(local_88 + 0x18),ListBoundCastData::InitListLocalState);
    }
    else {
      local_88._8_8_ = (BoundCastData *)0x0;
      BoundCastInfo::BoundCastInfo
                (__return_storage_ptr__,TryVectorNullCast,
                 (unique_ptr<duckdb::BoundCastData,_std::default_delete<duckdb::BoundCastData>,_true>
                  *)(local_88 + 8),(init_cast_local_state_t)0x0);
      local_88._24_8_ = local_88._8_8_;
    }
    if ((_Tuple_impl<0UL,_duckdb::BoundCastData_*,_std::default_delete<duckdb::BoundCastData>_>)
        local_88._24_8_ != (BoundCastData *)0x0) {
      (**(code **)(*(long *)local_88._24_8_ + 8))();
    }
  }
  return __return_storage_ptr__;
}

Assistant:

BoundCastInfo DefaultCasts::ListCastSwitch(BindCastInput &input, const LogicalType &source, const LogicalType &target) {
	switch (target.id()) {
	case LogicalTypeId::LIST:
		return BoundCastInfo(ListCast::ListToListCast, ListBoundCastData::BindListToListCast(input, source, target),
		                     ListBoundCastData::InitListLocalState);
	case LogicalTypeId::VARCHAR:
		return BoundCastInfo(
		    ListToVarcharCast,
		    ListBoundCastData::BindListToListCast(input, source, LogicalType::LIST(LogicalType::VARCHAR)),
		    ListBoundCastData::InitListLocalState);
	case LogicalTypeId::ARRAY:
		return BoundCastInfo(ListToArrayCast, BindListToArrayCast(input, source, target),
		                     ListBoundCastData::InitListLocalState);
	default:
		return DefaultCasts::TryVectorNullCast;
	}
}